

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.hpp
# Opt level: O2

size_t __thiscall websocketpp::http::parser::request::consume(request *this,char *buf,size_t len)

{
  size_t *psVar1;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  ulong uVar2;
  pointer __dest;
  size_type sVar3;
  bool bVar4;
  char *pcVar5;
  element_type *peVar6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end;
  string *psVar7;
  size_t sVar8;
  exception *peVar9;
  iterator begin;
  ptrdiff_t _Num;
  allocator local_a1;
  size_t local_a0;
  string local_98;
  char *local_78;
  string local_70;
  string local_50;
  
  if (this->m_ready != false) {
    return 0;
  }
  if ((this->super_parser).m_body_bytes_needed == 0) {
    this_00 = &this->m_buf;
    local_a0 = len;
    local_78 = buf;
    std::__cxx11::string::append
              ((char *)(this->m_buf).
                       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,(ulong)buf);
    peVar6 = (this->m_buf).
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    begin._M_current = (peVar6->_M_dataplus)._M_p;
    pcVar5 = begin._M_current;
    while( true ) {
      end = std::
            __search<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (begin._M_current,pcVar5 + peVar6->_M_string_length,"\r\n","");
      sVar8 = local_a0;
      uVar2 = (this->super_parser).m_header_bytes + 3 +
              ((long)end._M_current - (long)begin._M_current);
      (this->super_parser).m_header_bytes = uVar2;
      if (16000 < uVar2) {
        peVar9 = (exception *)__cxa_allocate_exception(0x70);
        std::__cxx11::string::string((string *)&local_98,"Maximum header size exceeded.",&local_a1);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        local_70._M_string_length = 0;
        local_50._M_string_length = 0;
        local_70.field_2._M_local_buf[0] = '\0';
        local_50.field_2._M_local_buf[0] = '\0';
        exception::exception(peVar9,&local_98,request_header_fields_too_large,&local_70,&local_50);
        __cxa_throw(peVar9,&exception::typeinfo,exception::~exception);
      }
      peVar6 = (this_00->
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      __dest = (peVar6->_M_dataplus)._M_p;
      if (end._M_current == __dest + peVar6->_M_string_length) {
        if (end._M_current != begin._M_current) {
          memmove(__dest,begin._M_current,(long)end._M_current - (long)begin._M_current);
          peVar6 = (this_00->
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
        }
        std::__cxx11::string::resize((ulong)peVar6);
        psVar1 = &(this->super_parser).m_header_bytes;
        *psVar1 = *psVar1 - ((this->m_buf).
                             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->_M_string_length;
        return sVar8;
      }
      sVar3 = (this->m_method)._M_string_length;
      if (end._M_current == begin._M_current) break;
      if (sVar3 == 0) {
        process(this,begin,(iterator)end._M_current);
      }
      else {
        parser::process_header(&this->super_parser,begin,(iterator)end._M_current);
      }
      peVar6 = (this_00->
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      begin._M_current = end._M_current + 2;
      pcVar5 = (peVar6->_M_dataplus)._M_p;
    }
    if (sVar3 == 0) {
LAB_001be104:
      peVar9 = (exception *)__cxa_allocate_exception(0x70);
      std::__cxx11::string::string((string *)&local_98,"Incomplete Request",&local_a1);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      local_70._M_string_length = 0;
      local_50._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      local_50.field_2._M_local_buf[0] = '\0';
      exception::exception(peVar9,&local_98,bad_request,&local_70,&local_50);
      __cxa_throw(peVar9,&exception::typeinfo,exception::~exception);
    }
    std::__cxx11::string::string((string *)&local_98,"Host",(allocator *)&local_70);
    psVar7 = parser::get_header(&this->super_parser,&local_98);
    sVar3 = psVar7->_M_string_length;
    std::__cxx11::string::~string((string *)&local_98);
    sVar8 = local_a0;
    if (sVar3 == 0) goto LAB_001be104;
    peVar6 = (this->m_buf).
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    pcVar5 = end._M_current +
             local_a0 + (2 - (long)((peVar6->_M_dataplus)._M_p + peVar6->_M_string_length));
    std::
    __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ::reset(&this_00->
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           );
    bVar4 = parser::prepare_body(&this->super_parser);
    if (!bVar4) goto LAB_001be06d;
    sVar8 = parser::process_body(&this->super_parser,local_78 + (long)pcVar5,sVar8 - (long)pcVar5);
    pcVar5 = pcVar5 + sVar8;
  }
  else {
    pcVar5 = (char *)parser::process_body(&this->super_parser,buf,len);
  }
  if ((this->super_parser).m_body_bytes_needed != 0) {
    return (size_t)pcVar5;
  }
LAB_001be06d:
  this->m_ready = true;
  return (size_t)pcVar5;
}

Assistant:

inline size_t request::consume(char const * buf, size_t len) {
    size_t bytes_processed;
    
    if (m_ready) {return 0;}
    
    if (m_body_bytes_needed > 0) {
        bytes_processed = process_body(buf,len);
        if (body_ready()) {
            m_ready = true;
        }
        return bytes_processed;
    }

    // copy new header bytes into buffer
    m_buf->append(buf,len);

    // Search for delimiter in buf. If found read until then. If not read all
    std::string::iterator begin = m_buf->begin();
    std::string::iterator end;

    for (;;) {
        // search for line delimiter
        end = std::search(
            begin,
            m_buf->end(),
            header_delimiter,
            header_delimiter+sizeof(header_delimiter)-1
        );
        
        m_header_bytes += (end-begin+sizeof(header_delimiter));
        
        if (m_header_bytes > max_header_size) {
            // exceeded max header size
            throw exception("Maximum header size exceeded.",
                status_code::request_header_fields_too_large);
        }

        if (end == m_buf->end()) {
            // we are out of bytes. Discard the processed bytes and copy the
            // remaining unprecessed bytes to the beginning of the buffer
            std::copy(begin,end,m_buf->begin());
            m_buf->resize(static_cast<std::string::size_type>(end-begin));
            m_header_bytes -= m_buf->size();

            return len;
        }

        //the range [begin,end) now represents a line to be processed.
        if (end-begin == 0) {
            // we got a blank line
            if (m_method.empty() || get_header("Host").empty()) {
                throw exception("Incomplete Request",status_code::bad_request);
            }

            bytes_processed = (
                len - static_cast<std::string::size_type>(m_buf->end()-end)
                    + sizeof(header_delimiter) - 1
            );

            // frees memory used temporarily during request parsing
            m_buf.reset();

            // if this was not an upgrade request and has a content length
            // continue capturing content-length bytes and expose them as a 
            // request body.
            
            if (prepare_body()) {
                bytes_processed += process_body(buf+bytes_processed,len-bytes_processed);
                if (body_ready()) {
                    m_ready = true;
                }
                return bytes_processed;
            } else {
                m_ready = true;

                // return number of bytes processed (starting bytes - bytes left)
                return bytes_processed;
            }
        } else {
            if (m_method.empty()) {
                this->process(begin,end);
            } else {
                this->process_header(begin,end);
            }
        }

        begin = end+(sizeof(header_delimiter)-1);
    }
}